

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O1

void glob_audio_properties(t_pd *dummy,t_floatarg flongform)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *outdevlist_00;
  char *pcVar7;
  int noutdevs;
  int nindevs;
  ulong local_89b0;
  uint local_89a8;
  uint local_89a4;
  int cancallback;
  int canmulti;
  ulong local_8998;
  ulong local_8990;
  ulong local_8988;
  ulong local_8980;
  ulong local_8978;
  ulong local_8970;
  ulong local_8968;
  ulong local_8960;
  ulong local_8958;
  ulong local_8950;
  ulong local_8948;
  ulong local_8940;
  ulong local_8938;
  ulong local_8930;
  char callback [80];
  char srate [80];
  char blocksize [80];
  char *outdevs [128];
  char *indevs [128];
  char outdevlist [16384];
  char indevlist [16384];
  
  local_89b0 = CONCAT44(local_89b0._4_4_,flongform);
  nindevs = 0;
  noutdevs = 0;
  canmulti = 0;
  cancallback = 0;
  pcVar7 = indevlist;
  outdevlist_00 = outdevlist;
  sys_get_audio_devs(pcVar7,&nindevs,outdevlist_00,&noutdevs,&canmulti,&cancallback,0x80,0x80,
                     audio_nextsettings.a_api);
  if (0 < (long)nindevs) {
    lVar6 = 0;
    do {
      indevs[lVar6] = pcVar7;
      lVar6 = lVar6 + 1;
      pcVar7 = pcVar7 + 0x80;
    } while (nindevs != lVar6);
  }
  if (0 < (long)noutdevs) {
    lVar6 = 0;
    do {
      outdevs[lVar6] = outdevlist_00;
      lVar6 = lVar6 + 1;
      outdevlist_00 = outdevlist_00 + 0x80;
    } while (noutdevs != lVar6);
  }
  if (nindevs == 0) {
    nindevs = 1;
    indevs[0] = "";
  }
  if (noutdevs == 0) {
    noutdevs = 1;
    outdevs[0] = "";
  }
  pdgui_vmess("set","rS","::audio_indevlist",(ulong)(uint)nindevs,indevs);
  pdgui_vmess("set","rS","::audio_outdevlist",(ulong)(uint)noutdevs,outdevs);
  iVar4 = audio_nextsettings.a_callback;
  if (initted == '\0') {
    audio_nextsettings.a_api = 9;
    audio_nextsettings.a_nindev = 1;
    audio_nextsettings.a_srate = 0xac44;
    audio_nextsettings.a_advance = 0x19;
    audio_nextsettings.a_nchoutdev = 1;
    audio_nextsettings.a_choutdevvec[0] = 2;
    audio_nextsettings.a_noutdev = 1;
    audio_nextsettings.a_outdevvec[0] = 0;
    audio_nextsettings.a_nchindev = 1;
    audio_nextsettings.a_chindevvec[0] = 2;
    audio_nextsettings.a_indevvec[0] = 0;
    audio_nextsettings.a_blocksize = 0x40;
    initted = '\x01';
  }
  iVar5 = audio_nextsettings.a_blocksize;
  local_89a4 = audio_nextsettings.a_indevvec[0];
  local_89a8 = audio_nextsettings.a_indevvec[1];
  local_8930 = (ulong)(uint)audio_nextsettings.a_indevvec[2];
  local_8938 = (ulong)(uint)audio_nextsettings.a_indevvec[3];
  local_8940 = (ulong)audio_nextsettings._24_8_ >> 0x20;
  local_8948 = (ulong)(uint)audio_nextsettings.a_chindevvec[1];
  local_8950 = (ulong)(uint)audio_nextsettings.a_chindevvec[2];
  local_8958 = (ulong)(uint)audio_nextsettings.a_chindevvec[3];
  local_8960 = (ulong)audio_nextsettings._44_8_ >> 0x20;
  local_8968 = (ulong)(uint)audio_nextsettings.a_outdevvec[1];
  local_8970 = (ulong)(uint)audio_nextsettings.a_outdevvec[2];
  local_8978 = (ulong)(uint)audio_nextsettings.a_outdevvec[3];
  bVar1 = 1 < audio_nextsettings.a_nindev;
  local_8980 = (ulong)audio_nextsettings._64_8_ >> 0x20;
  bVar2 = 1 < audio_nextsettings.a_noutdev;
  bVar3 = (float)local_89b0 != 0.0;
  local_89b0 = (ulong)(uint)audio_nextsettings.a_choutdevvec[1];
  local_8988 = (ulong)(uint)audio_nextsettings.a_choutdevvec[2];
  local_8990 = (ulong)(uint)audio_nextsettings.a_choutdevvec[3];
  local_8998 = (ulong)audio_nextsettings._84_8_ >> 0x20;
  sprintf(srate,"%s%d","",audio_nextsettings._84_8_ & 0xffffffff);
  pcVar7 = "!";
  if (cancallback != 0) {
    pcVar7 = "";
  }
  sprintf(callback,"%s%d",pcVar7,(ulong)(uint)iVar4);
  sprintf(blocksize,"%s%d","",(ulong)(uint)iVar5);
  pdgui_stub_deleteforkey((void *)0x0);
  pdgui_stub_vnew(&glob_pdobject,"pdtk_audio_dialog",glob_audio_properties,
                  "iiii iiii iiii iiii  s ii s i s",(ulong)local_89a4,(ulong)local_89a8,local_8930,
                  local_8938,local_8940,local_8948,local_8950,local_8958,local_8960,local_8968,
                  local_8970,local_8978,local_8980,local_89b0,local_8988,local_8990,srate,local_8998
                  ,(ulong)(uint)canmulti,callback,(ulong)(bVar3 || (bVar2 || bVar1)),blocksize);
  return;
}

Assistant:

void glob_audio_properties(t_pd *dummy, t_floatarg flongform)
{
    t_audiosettings as;
        /* these are all the devices on your system: */
    char indevlist[MAXNDEV*DEVDESCSIZE], outdevlist[MAXNDEV*DEVDESCSIZE];
    char device[MAXPDSTRING];
    char *indevs[MAXNDEV], *outdevs[MAXNDEV];
    int nindevs = 0, noutdevs = 0, canmulti = 0, cancallback = 0, i;
    char srate[80], callback[80], blocksize[80];

    sys_get_audio_devs(indevlist, &nindevs, outdevlist, &noutdevs, &canmulti,
         &cancallback, MAXNDEV, DEVDESCSIZE, audio_nextsettings.a_api);

    for (i = 0; i < nindevs; i++)
        indevs[i] = indevlist + i * DEVDESCSIZE;
    for (i = 0; i < noutdevs; i++)
        outdevs[i] = outdevlist + i * DEVDESCSIZE;

    if(!nindevs) {
        nindevs = 1;
        indevs[0] = "";
    }
    if(!noutdevs) {
        noutdevs = 1;
        outdevs[0] = "";
    }

    pdgui_vmess("set", "rS",
            "::audio_indevlist",
            nindevs, indevs);
    pdgui_vmess("set", "rS",
            "::audio_outdevlist",
            noutdevs, outdevs);

    sys_get_audio_settings(&as);

    if (as.a_nindev > 1 || as.a_noutdev > 1)
        flongform = 1;

    sprintf(srate, "%s%d", audio_isfixedsr(as.a_api)?"!":"", as.a_srate);
    sprintf(callback, "%s%d", cancallback?"":"!", as.a_callback);
    sprintf(blocksize, "%s%d", audio_isfixedblocksize(as.a_api)?"!":"", as.a_blocksize);

        /* values that are fixed and must not be changed by the GUI are
        prefixed with '!';  * the GUI will then display these values but
        disable their widgets */
    pdgui_stub_deleteforkey(0);
    pdgui_stub_vnew(&glob_pdobject,
        "pdtk_audio_dialog", (void *)glob_audio_properties,
        "iiii iiii iiii iiii  s ii s i s",
        as.a_indevvec   [0], as.a_indevvec   [1], as.a_indevvec   [2], as.a_indevvec   [3],
        as.a_chindevvec [0], as.a_chindevvec [1], as.a_chindevvec [2], as.a_chindevvec [3],
        as.a_outdevvec  [0], as.a_outdevvec  [1], as.a_outdevvec  [2], as.a_outdevvec  [3],
        as.a_choutdevvec[0], as.a_choutdevvec[1], as.a_choutdevvec[2], as.a_choutdevvec[3],
        srate,
        as.a_advance, canmulti,
        callback,
        (flongform != 0),
        blocksize);
}